

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::generateScaleOption
               (int32_t magnitude,DecNum *arbitrary,UnicodeString *sb,UErrorCode *status)

{
  UBool UVar1;
  UnicodeString local_c8;
  undefined4 local_88;
  undefined1 local_78 [8];
  DecimalQuantity dq;
  UErrorCode *status_local;
  UnicodeString *sb_local;
  DecNum *arbitrary_local;
  int32_t magnitude_local;
  
  dq._72_8_ = status;
  DecimalQuantity::DecimalQuantity((DecimalQuantity *)local_78);
  if (arbitrary == (DecNum *)0x0) {
    DecimalQuantity::setToInt((DecimalQuantity *)local_78,1);
  }
  else {
    DecimalQuantity::setToDecNum((DecimalQuantity *)local_78,arbitrary,(UErrorCode *)dq._72_8_);
    UVar1 = ::U_FAILURE(*(UErrorCode *)dq._72_8_);
    if (UVar1 != '\0') {
      local_88 = 1;
      goto LAB_00308d39;
    }
  }
  DecimalQuantity::adjustMagnitude((DecimalQuantity *)local_78,magnitude);
  DecimalQuantity::roundToInfinity((DecimalQuantity *)local_78);
  DecimalQuantity::toPlainString(&local_c8,(DecimalQuantity *)local_78);
  UnicodeString::append(sb,&local_c8);
  UnicodeString::~UnicodeString(&local_c8);
  local_88 = 0;
LAB_00308d39:
  DecimalQuantity::~DecimalQuantity((DecimalQuantity *)local_78);
  return;
}

Assistant:

void blueprint_helpers::generateScaleOption(int32_t magnitude, const DecNum* arbitrary, UnicodeString& sb,
                                            UErrorCode& status) {
    // Utilize DecimalQuantity/double_conversion to format this for us.
    DecimalQuantity dq;
    if (arbitrary != nullptr) {
        dq.setToDecNum(*arbitrary, status);
        if (U_FAILURE(status)) { return; }
    } else {
        dq.setToInt(1);
    }
    dq.adjustMagnitude(magnitude);
    dq.roundToInfinity();
    sb.append(dq.toPlainString());
}